

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O0

char * ShGetInfoLog(ShHandle handle)

{
  long lVar1;
  long *plVar2;
  char *s;
  TInfoSinkBase *local_28;
  TInfoSink *infoSink;
  TShHandleBase *base;
  ShHandle handle_local;
  
  if (handle == (ShHandle)0x0) {
    handle_local = (ShHandle)0x0;
  }
  else {
    lVar1 = (**(code **)(*handle + 0x10))();
    if (lVar1 == 0) {
      lVar1 = (**(code **)(*handle + 0x18))();
      if (lVar1 == 0) {
        return (char *)0x0;
      }
      plVar2 = (long *)(**(code **)(*handle + 0x18))();
      local_28 = (TInfoSinkBase *)(**(code **)(*plVar2 + 0x70))();
    }
    else {
      plVar2 = (long *)(**(code **)(*handle + 0x10))();
      local_28 = (TInfoSinkBase *)(**(code **)(*plVar2 + 0x30))();
    }
    s = glslang::TInfoSinkBase::c_str(local_28 + 1);
    glslang::TInfoSinkBase::operator<<(local_28,s);
    handle_local = glslang::TInfoSinkBase::c_str(local_28);
  }
  return (char *)handle_local;
}

Assistant:

const char* ShGetInfoLog(const ShHandle handle)
{
    if (handle == nullptr)
        return nullptr;

    TShHandleBase* base = static_cast<TShHandleBase*>(handle);
    TInfoSink* infoSink;

    if (base->getAsCompiler())
        infoSink = &(base->getAsCompiler()->getInfoSink());
    else if (base->getAsLinker())
        infoSink = &(base->getAsLinker()->getInfoSink());
    else
        return nullptr;

    infoSink->info << infoSink->debug.c_str();
    return infoSink->info.c_str();
}